

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O3

value_type_conflict1 __thiscall
CCDPP_MPI::predict(CCDPP_MPI *this,vector<Rating,_std::allocator<Rating>_> *ratings)

{
  pool *ppVar1;
  pointer pdVar2;
  int iVar3;
  int workload;
  int size;
  value_type_conflict1 global_rmse;
  value_type_conflict1 result;
  vector<double,_std::allocator<double>_> rmses;
  int local_80;
  int local_7c;
  value_type_conflict1 local_78;
  value_type_conflict1 local_70;
  function0<void> local_68;
  vector<double,_std::allocator<double>_> local_48;
  
  iVar3 = this->Q_workload * this->parameter->k;
  MPI_Allgather(this->Q,iVar3,&ompi_mpi_double,this->entire_Q,iVar3,&ompi_mpi_double,
                &ompi_mpi_comm_world);
  iVar3 = this->P_workload * this->parameter->k;
  MPI_Allgather(this->P,iVar3,&ompi_mpi_double,this->entire_P,iVar3,&ompi_mpi_double,
                &ompi_mpi_comm_world);
  local_7c = (int)((ulong)((long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  iVar3 = this->parameter->num_of_thread;
  local_68.super_function_base.vtable = (vtable_base *)0x0;
  local_80 = (local_7c / iVar3 + 1) - (uint)(local_7c % iVar3 == 0);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)iVar3,(value_type_conflict1 *)&local_68,(allocator_type *)&local_78);
  if (0 < this->parameter->num_of_thread) {
    iVar3 = 0;
    do {
      ppVar1 = this->thread_pool;
      local_68.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x30);
      local_68.super_function_base.vtable =
           (vtable_base *)
           _ZZN5boost9function0IvE9assign_toISt5_BindIFZN9CCDPP_MPI7predictERSt6vectorI6RatingSaIS6_EEEUliE_iEEEEvT_E13stored_vtable
      ;
      *(int **)local_68.super_function_base.functor.members._0_8_ = &local_80;
      *(int **)((long)local_68.super_function_base.functor.members._0_8_ + 8) = &local_7c;
      *(vector<Rating,_std::allocator<Rating>_> **)
       ((long)local_68.super_function_base.functor.members._0_8_ + 0x10) = ratings;
      *(CCDPP_MPI **)((long)local_68.super_function_base.functor.members._0_8_ + 0x18) = this;
      *(vector<double,_std::allocator<double>_> **)
       ((long)local_68.super_function_base.functor.members._0_8_ + 0x20) = &local_48;
      *(int *)((long)local_68.super_function_base.functor.members._0_8_ + 0x28) = iVar3;
      boost::threadpool::detail::
      pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
      ::schedule((ppVar1->m_core).px,&local_68);
      boost::function0<void>::~function0(&local_68);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->parameter->num_of_thread);
  }
  boost::threadpool::detail::
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((this->thread_pool->m_core).px,(void *)0x0);
  local_68.super_function_base.vtable = (vtable_base *)0x0;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_68.super_function_base.vtable = (vtable_base *)0x0;
    pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_68.super_function_base.vtable =
           (vtable_base *)((double)local_68.super_function_base.vtable + *pdVar2);
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  MPI_Allreduce(&local_68,&local_78,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    local_70 = local_78;
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    local_78 = local_70;
  }
  return local_78;
}

Assistant:

value_type predict(vector<Rating> &ratings) {

        // For prediction, you need Q and P, thus Q and P needs to be communicated.
        MPI_Allgather(Q, parameter->k * Q_workload, VALUE_MPI_TYPE, entire_Q, parameter->k * Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
        MPI_Allgather(P, parameter->k * P_workload, VALUE_MPI_TYPE, entire_P, parameter->k * P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

        int size = ratings.size();
        int workload = size / parameter->num_of_thread + ((size % parameter->num_of_thread == 0) ? 0 : 1);

        vector<value_type> rmses(parameter->num_of_thread, 0);

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(start + workload, size);

                for (int i = start; i < end; i++) {

                    Rating &rating = ratings[i];

                    value_type prediction = 0;
                    for (int d = 0; d < parameter->k; d++) {
                        prediction += entire_Q[d * Q_workload * num_of_machines + rating.user_id] * entire_P[d * P_workload * num_of_machines + rating.item_id];
                    }

                    value_type error = rating.score - prediction;
                    rmses[thread_index] += error * error;
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type result = 0;

        for (value_type rmse:rmses) {
            result += rmse;
        }

        value_type global_rmse;
        MPI_Allreduce(&result, &global_rmse, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

        return global_rmse;
    }